

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_dispel_magic(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CClass *pCVar3;
  char *pcVar4;
  char_data *in_RDX;
  int spell;
  bool commune;
  bool found;
  AFFECT_DATA *af;
  CHAR_DATA *victim;
  char buf [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  char *__s;
  undefined4 in_stack_ffffffffffffc9c0;
  undefined2 in_stack_ffffffffffffc9c4;
  undefined1 uVar5;
  undefined1 uVar6;
  CHAR_DATA *in_stack_ffffffffffffc9c8;
  AFFECT_DATA *pAVar7;
  CHAR_DATA *this;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  int in_stack_ffffffffffffcbe4;
  CHAR_DATA *in_stack_ffffffffffffcbe8;
  CHAR_DATA *in_stack_ffffffffffffcbf0;
  char *in_stack_ffffffffffffdbc0;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char local_2428;
  undefined1 in_stack_ffffffffffffdc0a;
  undefined1 in_stack_ffffffffffffdc0b;
  int in_stack_ffffffffffffdc0c;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  CHAR_DATA *in_stack_ffffffffffffdc18;
  int in_stack_ffffffffffffdc20;
  
  this = (CHAR_DATA *)0x0;
  uVar6 = 0;
  uVar5 = 0;
  if ((in_RDX->fighting != (CHAR_DATA *)0x0) || (bVar1 = str_cmp(target_name,""), bVar1)) {
    if ((in_RDX->fighting != (CHAR_DATA *)0x0) && (bVar1 = str_cmp(target_name,""), !bVar1)) {
      this = in_RDX->fighting;
    }
    target_name = one_argument((char *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(
                                                  in_stack_ffffffffffffc9c4,
                                                  in_stack_ffffffffffffc9c0))),
                               (char *)in_stack_ffffffffffffc9b8);
    one_argument((char *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffc9c4,
                                                                in_stack_ffffffffffffc9c0))),
                 (char *)in_stack_ffffffffffffc9b8);
    if ((this == (CHAR_DATA *)0x0) &&
       (this = get_char_room(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0),
       this == (CHAR_DATA *)0x0)) {
      in_RDX->wait = 0;
      send_to_char((char *)0x0,in_stack_ffffffffffffc9c8);
    }
    else {
      pCVar3 = char_data::Class(this);
      if (pCVar3->ctype == 2) {
        uVar5 = 1;
      }
      bVar1 = is_npc(in_stack_ffffffffffffc9b8);
      if (((!bVar1) && (in_RDX != this)) &&
         ((in_RDX->fighting == (CHAR_DATA *)0x0 || (this->fighting == (CHAR_DATA *)0x0)))) {
        __s = &stack0xffffffffffffc9d8;
        pcVar4 = pers(in_stack_ffffffffffffc9c8,
                      (CHAR_DATA *)
                      CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffc9c4,
                                                             in_stack_ffffffffffffc9c0))));
        sprintf(__s,"Die, %s, you sorcerous dog!",pcVar4);
        do_myell(this,(char *)in_stack_ffffffffffffc9c8,
                 (CHAR_DATA *)
                 CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffc9c4,
                                                        in_stack_ffffffffffffc9c0))));
      }
      if ((this->fighting == (CHAR_DATA *)0x0) && (in_RDX != this)) {
        multi_hit(in_stack_ffffffffffffcbf0,in_stack_ffffffffffffcbe8,in_stack_ffffffffffffcbe4);
      }
      if (local_2428 == '\0') {
        for (pAVar7 = this->affected; pAVar7 != (AFFECT_DATA *)0x0; pAVar7 = pAVar7->next) {
          if ((skill_table[pAVar7->type].dispel & 1U) != 0) {
            check_dispel_cancellation
                      (in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10
                       ,in_stack_ffffffffffffdc0c,(bool)in_stack_ffffffffffffdc0b,
                       (bool)in_stack_ffffffffffffdc0a);
          }
        }
      }
      else {
        iVar2 = find_spell(in_stack_ffffffffffffc9d8,(char *)this);
        if (0 < iVar2) {
          for (pAVar7 = this->affected; (pAVar7 != (AFFECT_DATA *)0x0 && (pAVar7->type != iVar2));
              pAVar7 = pAVar7->next) {
          }
          if (((pAVar7 != (AFFECT_DATA *)0x0) && (pAVar7->type != 0)) &&
             ((skill_table[pAVar7->type].dispel & 1U) != 0)) {
            check_dispel_cancellation
                      (in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10
                       ,in_stack_ffffffffffffdc0c,(bool)in_stack_ffffffffffffdc0b,
                       (bool)in_stack_ffffffffffffdc0a);
          }
        }
      }
    }
  }
  else {
    in_RDX->wait = 0;
    send_to_char((char *)this,in_stack_ffffffffffffc9c8);
  }
  return;
}

Assistant:

void spell_dispel_magic(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg1[MSL], arg2[MSL];
	char buf[MSL];
	CHAR_DATA *victim = nullptr;
	AFFECT_DATA *af;
	bool found = false;
	bool commune = false;
	int spell;

	if (!ch->fighting && !str_cmp(target_name, ""))
	{
		ch->wait = 0;

		send_to_char("Syntax: cast 'dispel magic' <target> [spellname].\n\r", ch);
		return;
	}

	if (ch->fighting && !str_cmp(target_name, ""))
		victim = ch->fighting;

	target_name = one_argument(target_name, arg1);
	one_argument(target_name, arg2);

	if (!victim)
	{
		if ((victim = get_char_room(ch, arg1)) == nullptr)
		{
			ch->wait = 0;

			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (ch->Class()->ctype == CLASS_COMMUNER)
		commune = true;

	if (!is_npc(victim) && (ch != victim) && (!ch->fighting || !victim->fighting))
	{
		sprintf(buf, "Die, %s, you sorcerous dog!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (!victim->fighting && (ch != victim))
		multi_hit(victim, ch, TYPE_UNDEFINED);

	if (arg2[0] == '\0')
	{
		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (skill_table[af->type].dispel & CAN_DISPEL)
			{
				check_dispel_cancellation(level, victim, ch, af->type, commune, false);
				found = true;
			}
		}
	}
	else
	{
		spell = find_spell(victim, arg2);

		if (spell < 1)
			return;

		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (af->type == spell)
				break;
		}

		if (!af || !af->type || !(skill_table[af->type].dispel & CAN_DISPEL))
			return;

		check_dispel_cancellation(level + 3, victim, ch, af->type, commune, false);
	}

	return;
}